

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

Real nga_sdot_patch_(Integer *g_a,char *t_a,Integer *alo,Integer *ahi,Integer *g_b,char *t_b,
                    Integer *blo,Integer *bhi,int alen,int blen)

{
  Integer btype;
  Integer atype;
  Real retval;
  Integer in_stack_00000138;
  char *in_stack_00000140;
  Integer *in_stack_00000198;
  Integer in_stack_000001a0;
  char *in_stack_00000918;
  Integer in_stack_00000920;
  Integer *in_stack_00000928;
  Integer *in_stack_00000930;
  char *in_stack_00000938;
  Integer in_stack_00000940;
  Integer *in_stack_00000950;
  Integer *in_stack_00000958;
  void *in_stack_00000960;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_34;
  
  pnga_inquire_type(in_stack_000001a0,in_stack_00000198);
  pnga_inquire_type(in_stack_000001a0,in_stack_00000198);
  if ((local_40 != local_48) || (local_40 != 0x3eb)) {
    pnga_error(in_stack_00000140,in_stack_00000138);
  }
  pnga_dot_patch(in_stack_00000940,in_stack_00000938,in_stack_00000930,in_stack_00000928,
                 in_stack_00000920,in_stack_00000918,in_stack_00000950,in_stack_00000958,
                 in_stack_00000960);
  return local_34;
}

Assistant:

Real nga_sdot_patch_(Integer *g_a, char *t_a, int alen, Integer *alo, Integer *ahi, Integer *g_b, char *t_b, int blen, Integer *blo, Integer *bhi)
#endif
{
    Real retval;
    Integer atype, btype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    if (atype != btype || atype != C_FLOAT) pnga_error(" wrong types ", 0L);
    wnga_dot_patch(*g_a, t_a, alo, ahi, *g_b, t_b, blo, bhi, &retval);

    return retval;
}